

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::TileBufferTask::~TileBufferTask(TileBufferTask *this)

{
  ~TileBufferTask(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~TileBufferTask () override
        {
            _tile_group->push (_tile);
        }